

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instruction.cpp
# Opt level: O2

size_t __thiscall cs222::Instruction::getLength(Instruction *this)

{
  bool bVar1;
  Type TVar2;
  const_iterator cVar3;
  unsigned_long uVar4;
  size_type sVar5;
  string local_50;
  string op;
  
  std::__cxx11::string::string((string *)&op,(string *)&this->operation);
  if (*op._M_dataplus._M_p == '+') {
    std::__cxx11::string::substr((ulong)&local_50,(ulong)&op);
    std::__cxx11::string::operator=((string *)&op,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  bVar1 = isOperation(&op);
  if (bVar1) {
    local_50._M_dataplus._M_p._0_4_ = getFormat(this);
    cVar3 = std::
            _Hashtable<cs222::Instruction::Format,_std::pair<const_cs222::Instruction::Format,_unsigned_long>,_std::allocator<std::pair<const_cs222::Instruction::Format,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<cs222::Instruction::Format>,_std::hash<cs222::Instruction::Format>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find((_Hashtable<cs222::Instruction::Format,_std::pair<const_cs222::Instruction::Format,_unsigned_long>,_std::allocator<std::pair<const_cs222::Instruction::Format,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<cs222::Instruction::Format>,_std::hash<cs222::Instruction::Format>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)Length,(key_type *)&local_50);
    uVar4 = *(unsigned_long *)
             ((long)cVar3.
                    super__Node_iterator_base<std::pair<const_cs222::Instruction::Format,_unsigned_long>,_false>
                    ._M_cur + 0x10);
  }
  else {
    bVar1 = std::operator==(&op,"WORD");
    if (bVar1) {
      uVar4 = 3;
    }
    else {
      bVar1 = std::operator==(&op,"RESW");
      if (bVar1) {
        Operand::getValue_abi_cxx11_(&local_50,&(this->operands).first);
        uVar4 = std::__cxx11::stoul(&local_50,(size_t *)0x0,10);
        uVar4 = uVar4 * 3;
      }
      else {
        bVar1 = std::operator==(&op,"RESB");
        if (!bVar1) {
          bVar1 = std::operator==(&op,"BYTE");
          if (bVar1) {
            Operand::getValue_abi_cxx11_(&local_50,&(this->operands).first);
            std::__cxx11::string::~string((string *)&local_50);
            TVar2 = Operand::getType(&(this->operands).first);
            bVar1 = TVar2 == HEX_CONSTANT;
            sVar5 = local_50._M_string_length;
          }
          else {
            bVar1 = std::operator==(&this->label,"*");
            if (!bVar1) {
              uVar4 = 0;
              goto LAB_0010fc6e;
            }
            sVar5 = (this->operation)._M_string_length;
            TVar2 = Operand::getType(&(this->operands).first);
            bVar1 = TVar2 == HEX_LITERAL;
          }
          uVar4 = sVar5 >> bVar1;
          goto LAB_0010fc6e;
        }
        Operand::getValue_abi_cxx11_(&local_50,&(this->operands).first);
        uVar4 = std::__cxx11::stoul(&local_50,(size_t *)0x0,10);
      }
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
LAB_0010fc6e:
  std::__cxx11::string::~string((string *)&op);
  return uVar4;
}

Assistant:

size_t Instruction::getLength() const
    {
        size_t length = 0;
        std::string op = operation;
        if (op[0] == '+')
            op = op.substr(1);

        if (isOperation(op))
        {
            length = Length.find(getFormat())->second;
        }
        else if (op == DIR_WORD)
        {
            length = 3;
        }
        else if (op == DIR_RESW)
        {
            length = 3 * std::stoul(operands.first.getValue());
        }
        else if (op == DIR_RESB)
        {
            length = std::stoul(operands.first.getValue());
        }
        else if (op == DIR_BYTE)
        {
            length = operands.first.getValue().length();
            if (operands.first.getType() == Operand::HEX_CONSTANT)
            {
                length /= 2;
            }
        }
        else if (label == "*") {
            length = operation.length();
            if (operands.first.getType() == Operand::HEX_LITERAL)
            {
                length /= 2;
            }
        }

        return length;
    }